

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_reset(tsd_t *tsd,arena_t *arena)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long in_RSI;
  long in_RDI;
  uint j;
  uint i_1;
  rtree_ctx_t *rtree_ctx;
  alloc_ctx_t alloc_ctx;
  size_t usize;
  void *ptr;
  extent_t *extent;
  uintptr_t bits;
  rtree_leaf_elm_t *elm;
  size_t ret;
  uint8_t state;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  void *result;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  arena_t *in_stack_fffffffffffffd10;
  tsd_t *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  tsdn_t *in_stack_fffffffffffffd28;
  uint local_2c8;
  uint local_2c4;
  extent_t *local_2a0;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  rtree_ctx_t *in_stack_fffffffffffffd80;
  rtree_t *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  uint local_134;
  tsdn_t *local_d8;
  ushort uStack_1a;
  int local_4;
  
  malloc_mutex_lock(in_stack_fffffffffffffd28,
                    (malloc_mutex_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20))
  ;
  local_2a0 = extent_list_first((extent_list_t *)(in_RSI + 0x2870));
  do {
    if (local_2a0 == (extent_t *)0x0) {
      malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                          (malloc_mutex_t *)in_stack_fffffffffffffd18);
      for (local_2c4 = 0; local_2c4 < 0x24; local_2c4 = local_2c4 + 1) {
        for (local_2c8 = 0; local_2c8 < bin_infos[local_2c4].n_shards; local_2c8 = local_2c8 + 1) {
          arena_bin_reset(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                          (bin_t *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        }
      }
      *(undefined8 *)(in_RSI + 0x2868) = 0;
      return;
    }
    pvVar2 = extent_base_get(local_2a0);
    malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                        (malloc_mutex_t *)in_stack_fffffffffffffd18);
    lVar3 = in_RDI + 0x30;
    uVar4 = (ulong)pvVar2 >> 0x1e & 0xf;
    uVar5 = (ulong)pvVar2 & 0xffffffffc0000000;
    if (*(ulong *)(lVar3 + uVar4 * 0x10) == uVar5) {
      local_d8 = (tsdn_t *)
                 (*(long *)(lVar3 + uVar4 * 0x10 + 8) + ((ulong)pvVar2 >> 0xc & 0x3ffff) * 8);
    }
    else if (*(ulong *)(in_RDI + 0x130) == uVar5) {
      lVar1 = *(long *)(in_RDI + 0x138);
      *(undefined8 *)(in_RDI + 0x130) = *(undefined8 *)(lVar3 + uVar4 * 0x10);
      *(undefined8 *)(in_RDI + 0x138) = *(undefined8 *)(lVar3 + uVar4 * 0x10 + 8);
      *(ulong *)(lVar3 + uVar4 * 0x10) = uVar5;
      *(long *)(lVar3 + uVar4 * 0x10 + 8) = lVar1;
      local_d8 = (tsdn_t *)(lVar1 + ((ulong)pvVar2 >> 0xc & 0x3ffff) * 8);
    }
    else {
      for (local_134 = 1; local_134 < 8; local_134 = local_134 + 1) {
        if (*(ulong *)(in_RDI + 0x130 + (ulong)local_134 * 0x10) == uVar5) {
          lVar1 = *(long *)(lVar3 + (ulong)local_134 * 0x10 + 0x108);
          if (local_134 == 0) {
            *(undefined8 *)(in_RDI + 0x130) = *(undefined8 *)(lVar3 + uVar4 * 0x10);
            *(undefined8 *)(in_RDI + 0x138) = *(undefined8 *)(lVar3 + uVar4 * 0x10 + 8);
          }
          else {
            *(undefined8 *)(in_RDI + 0x130 + (ulong)local_134 * 0x10) =
                 *(undefined8 *)(in_RDI + 0x130 + (ulong)(local_134 - 1) * 0x10);
            *(undefined8 *)(lVar3 + (ulong)local_134 * 0x10 + 0x108) =
                 *(undefined8 *)(lVar3 + (ulong)(local_134 - 1) * 0x10 + 0x108);
            *(undefined8 *)(in_RDI + 0x130 + (ulong)(local_134 - 1) * 0x10) =
                 *(undefined8 *)(lVar3 + uVar4 * 0x10);
            *(undefined8 *)(lVar3 + (ulong)(local_134 - 1) * 0x10 + 0x108) =
                 *(undefined8 *)(lVar3 + uVar4 * 0x10 + 8);
          }
          *(ulong *)(lVar3 + uVar4 * 0x10) = uVar5;
          *(long *)(lVar3 + uVar4 * 0x10 + 8) = lVar1;
          local_d8 = (tsdn_t *)(lVar1 + ((ulong)pvVar2 >> 0xc & 0x3ffff) * 8);
          goto LAB_00113a99;
        }
      }
      local_d8 = (tsdn_t *)
                 rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                            CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                            SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
    }
LAB_00113a99:
    switch(0x113bb0) {
    case 0:
      local_4 = 0;
      break;
    case 1:
      local_4 = 2;
    }
    if (local_4 - 1U < 2) {
      uStack_1a = (ushort)((ulong)*(void **)&local_d8->tsd >> 0x30);
    }
    else if (local_4 == 5) {
      uStack_1a = (ushort)((ulong)*(void **)&local_d8->tsd >> 0x30);
    }
    else {
      uStack_1a = (ushort)((ulong)*(void **)&local_d8->tsd >> 0x30);
    }
    in_stack_fffffffffffffd94 = (uint)uStack_1a;
    large_dalloc((tsdn_t *)in_stack_fffffffffffffd18,(extent_t *)in_stack_fffffffffffffd10);
    malloc_mutex_lock(local_d8,(malloc_mutex_t *)CONCAT44(local_4,in_stack_fffffffffffffd20));
    local_2a0 = extent_list_first((extent_list_t *)(in_RSI + 0x2870));
    in_stack_fffffffffffffd24 = local_4;
  } while( true );
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (extent_t *extent = extent_list_first(&arena->large); extent !=
	    NULL; extent = extent_list_first(&arena->large)) {
		void *ptr = extent_base_get(extent);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		alloc_ctx_t alloc_ctx;
		rtree_ctx_t *rtree_ctx = tsd_rtree_ctx(tsd);
		rtree_szind_slab_read(tsd_tsdn(tsd), &extents_rtree, rtree_ctx,
		    (uintptr_t)ptr, true, &alloc_ctx.szind, &alloc_ctx.slab);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		large_dalloc(tsd_tsdn(tsd), extent);
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena,
			    &arena->bins[i].bin_shards[j]);
		}
	}

	atomic_store_zu(&arena->nactive, 0, ATOMIC_RELAXED);
}